

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnDelegateExpr(BinaryReaderIR *this,Index depth)

{
  Result RVar1;
  TryExpr *pTVar2;
  Enum EVar3;
  char *format;
  LabelNode *label;
  Location local_98;
  Var local_78;
  
  label = (LabelNode *)0x0;
  RVar1 = TopLabel(this,&label);
  EVar3 = Error;
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  if (label->label_type == Try) {
    pTVar2 = cast<wabt::TryExpr,wabt::Expr>(label->context);
    if (pTVar2->kind != Delegate) {
      if (pTVar2->kind != Plain) {
        format = "delegate not allowed in try-catch";
        goto LAB_00164b8d;
      }
      pTVar2->kind = Delegate;
    }
    GetLocation(&local_98,this);
    Var::Var(&local_78,depth,&local_98);
    Var::operator=(&pTVar2->delegate_target,&local_78);
    Var::~Var(&local_78);
    PopLabel(this);
    EVar3 = Ok;
  }
  else {
    format = "delegate not inside try block";
LAB_00164b8d:
    PrintError(this,format);
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReaderIR::OnDelegateExpr(Index depth) {
  LabelNode* label = nullptr;
  CHECK_RESULT(TopLabel(&label));

  if (label->label_type != LabelType::Try) {
    PrintError("delegate not inside try block");
    return Result::Error;
  }

  auto* try_ = cast<TryExpr>(label->context);

  if (try_->kind == TryKind::Plain) {
    try_->kind = TryKind::Delegate;
  } else if (try_->kind != TryKind::Delegate) {
    PrintError("delegate not allowed in try-catch");
    return Result::Error;
  }

  try_->delegate_target = Var(depth, GetLocation());

  PopLabel();
  return Result::Ok;
}